

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-util.c
# Opt level: O0

void borg_sort_swap_hook(void *u,void *v,int a,int b)

{
  undefined2 uVar1;
  undefined8 uVar2;
  int16_t whattmp;
  char *texttmp;
  int16_t *what;
  char **text;
  int b_local;
  int a_local;
  void *v_local;
  void *u_local;
  
  uVar2 = *(undefined8 *)((long)u + (long)a * 8);
  *(undefined8 *)((long)u + (long)a * 8) = *(undefined8 *)((long)u + (long)b * 8);
  *(undefined8 *)((long)u + (long)b * 8) = uVar2;
  uVar1 = *(undefined2 *)((long)v + (long)a * 2);
  *(undefined2 *)((long)v + (long)a * 2) = *(undefined2 *)((long)v + (long)b * 2);
  *(undefined2 *)((long)v + (long)b * 2) = uVar1;
  return;
}

Assistant:

void borg_sort_swap_hook(void *u, void *v, int a, int b)
{
    char   **text = (char **)(u);
    int16_t *what = (int16_t *)(v);

    char   *texttmp;
    int16_t whattmp;

    /* Swap "text" */
    texttmp = text[a];
    text[a] = text[b];
    text[b] = texttmp;

    /* Swap "what" */
    whattmp = what[a];
    what[a] = what[b];
    what[b] = whattmp;
}